

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O2

serial_ptr<char> * __thiscall
BCL::
serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
::operator()(serial_ptr<char> *__return_storage_ptr__,
            serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>
            *this,string *string)

{
  int i;
  char *__p;
  ulong uVar1;
  __shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (__return_storage_ptr__->ptr).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->ptr).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar1 = string->_M_string_length;
  __return_storage_ptr__->N = uVar1;
  __p = (char *)operator_new__(uVar1);
  std::__shared_ptr<char,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<char,void>
            ((__shared_ptr<char,(__gnu_cxx::_Lock_policy)2> *)&local_20,__p);
  std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  for (uVar1 = 0; uVar1 < string->_M_string_length; uVar1 = uVar1 + 1) {
    (__return_storage_ptr__->ptr).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr[uVar1]
         = (string->_M_dataplus)._M_p[uVar1];
  }
  return __return_storage_ptr__;
}

Assistant:

serial_ptr <char> operator()(const std::string &string) const noexcept {
      serial_ptr <char> ptr;
      ptr.N = string.length();
      ptr.ptr = std::shared_ptr <char> (new char[ptr.N]);

      for (int i = 0; i < string.length(); i++) {
        ptr.ptr.get()[i] = string[i];
      }

      return ptr;
    }